

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O1

void __thiscall
CppUnit::PlugInManager::load
          (PlugInManager *this,string *libraryFileName,PlugInParameters *parameters)

{
  size_type *psVar1;
  DynamicLibraryManager *pDVar2;
  code *pcVar3;
  TestFactoryRegistry *pTVar4;
  undefined1 local_80 [8];
  PlugInInfo info;
  CppUnitTestPlugIn local_40 [2];
  
  psVar1 = &info.m_fileName._M_string_length;
  info.m_fileName._M_dataplus._M_p = (pointer)0x0;
  info.m_fileName._M_string_length._0_1_ = 0;
  local_80 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_assign((string *)local_80);
  pDVar2 = (DynamicLibraryManager *)operator_new(0x28);
  DynamicLibraryManager::DynamicLibraryManager(pDVar2,libraryFileName);
  info.m_fileName.field_2._8_8_ = pDVar2;
  info.m_interface = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&info.m_interface,"cppunitTestPlugIn","");
  pcVar3 = (code *)DynamicLibraryManager::findSymbol(pDVar2,(string *)&info.m_interface);
  if (info.m_interface != local_40) {
    operator_delete(info.m_interface,(long)local_40[0]._vptr_CppUnitTestPlugIn + 1);
  }
  info.m_manager = (DynamicLibraryManager *)(*pcVar3)();
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  push_back(&this->m_plugIns,(value_type *)local_80);
  pDVar2 = info.m_manager;
  info.m_interface = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&info.m_interface,"All Tests","");
  pTVar4 = TestFactoryRegistry::getRegistry((string *)&info.m_interface);
  (**pDVar2->m_libraryHandle)(pDVar2,pTVar4,parameters);
  if (info.m_interface != local_40) {
    operator_delete(info.m_interface,(long)local_40[0]._vptr_CppUnitTestPlugIn + 1);
  }
  if (local_80 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_80,
                    CONCAT71(info.m_fileName._M_string_length._1_7_,
                             (undefined1)info.m_fileName._M_string_length) + 1);
  }
  return;
}

Assistant:

void
PlugInManager::load( const std::string &libraryFileName,
                     const PlugInParameters &parameters )
{
  PlugInInfo info;
  info.m_fileName = libraryFileName;
  info.m_manager = new DynamicLibraryManager( libraryFileName );

  TestPlugInSignature plug = (TestPlugInSignature)((uintptr_t)info.m_manager->findSymbol( 
        CPPUNIT_STRINGIZE( CPPUNIT_PLUGIN_EXPORTED_NAME ) ));
  info.m_interface = (*plug)();

  m_plugIns.push_back( info );
  
  info.m_interface->initialize( &TestFactoryRegistry::getRegistry(), parameters );
}